

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp_write_nonblock.c
# Opt level: O0

int waitsocket(libssh2_socket_t socket_fd,LIBSSH2_SESSION *session)

{
  uint uVar1;
  int iVar2;
  fd_set *__arr;
  uint __i;
  int dir;
  fd_set *readfd;
  fd_set *writefd;
  fd_set fd;
  undefined1 auStack_28 [4];
  int rc;
  timeval timeout;
  LIBSSH2_SESSION *session_local;
  libssh2_socket_t socket_fd_local;
  
  timeout.tv_usec = (__suseconds_t)session;
  readfd = (fd_set *)0x0;
  ___i = (fd_set *)0x0;
  _auStack_28 = 10;
  timeout.tv_sec = 0;
  for (__arr._0_4_ = 0; (uint)__arr < 0x10; __arr._0_4_ = (uint)__arr + 1) {
    fd.__fds_bits[(ulong)(uint)__arr - 1] = 0;
  }
  fd.__fds_bits[(long)(socket_fd / 0x40) + -1] =
       1L << ((byte)((long)socket_fd % 0x40) & 0x3f) | fd.__fds_bits[(long)(socket_fd / 0x40) + -1];
  uVar1 = libssh2_session_block_directions(timeout.tv_usec,0x40,(long)socket_fd % 0x40 & 0xffffffff)
  ;
  if ((uVar1 & 1) != 0) {
    ___i = (fd_set *)&writefd;
  }
  if ((uVar1 & 2) != 0) {
    readfd = (fd_set *)&writefd;
  }
  iVar2 = select(socket_fd + 1,___i,(fd_set *)readfd,(fd_set *)0x0,(timeval *)auStack_28);
  return iVar2;
}

Assistant:

static int waitsocket(libssh2_socket_t socket_fd, LIBSSH2_SESSION *session)
{
    struct timeval timeout;
    int rc;
    fd_set fd;
    fd_set *writefd = NULL;
    fd_set *readfd = NULL;
    int dir;

    timeout.tv_sec = 10;
    timeout.tv_usec = 0;

    FD_ZERO(&fd);

    FD_SET(socket_fd, &fd);

    /* now make sure we wait in the correct direction */
    dir = libssh2_session_block_directions(session);

    if(dir & LIBSSH2_SESSION_BLOCK_INBOUND)
        readfd = &fd;

    if(dir & LIBSSH2_SESSION_BLOCK_OUTBOUND)
        writefd = &fd;

    rc = select((int)(socket_fd + 1), readfd, writefd, NULL, &timeout);

    return rc;
}